

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.cc
# Opt level: O1

size_t __thiscall
CoreML::Specification::BayesianProbitRegressor::ByteSizeLong(BayesianProbitRegressor *this)

{
  Rep *pRVar1;
  BayesianProbitRegressor_Gaussian *pBVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  size_t sVar9;
  void **ppvVar10;
  
  sVar9 = (size_t)(this->features_).super_RepeatedPtrFieldBase.current_size_;
  pRVar1 = (this->features_).super_RepeatedPtrFieldBase.rep_;
  ppvVar10 = pRVar1->elements;
  if (pRVar1 == (Rep *)0x0) {
    ppvVar10 = (void **)0x0;
  }
  if (sVar9 != 0) {
    lVar7 = sVar9 * 8;
    lVar8 = 0;
    do {
      sVar5 = BayesianProbitRegressor_FeatureWeight::ByteSizeLong
                        (*(BayesianProbitRegressor_FeatureWeight **)((long)ppvVar10 + lVar8));
      uVar4 = (uint)sVar5 | 1;
      iVar3 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar9 = sVar9 + sVar5 + (ulong)(iVar3 * 9 + 0x49U >> 6);
      lVar8 = lVar8 + 8;
    } while (lVar7 - lVar8 != 0);
  }
  lVar7 = *(long *)(((ulong)(this->regressioninputfeaturename_).tagged_ptr_.ptr_ &
                    0xfffffffffffffffe) + 8);
  if (lVar7 != 0) {
    uVar4 = (uint)lVar7 | 1;
    iVar3 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
      }
    }
    sVar9 = sVar9 + lVar7 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 1;
  }
  lVar7 = *(long *)(((ulong)(this->optimisminputfeaturename_).tagged_ptr_.ptr_ & 0xfffffffffffffffe)
                   + 8);
  if (lVar7 != 0) {
    uVar4 = (uint)lVar7 | 1;
    iVar3 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
      }
    }
    sVar9 = sVar9 + lVar7 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 1;
  }
  lVar7 = *(long *)(((ulong)(this->samplingscaleinputfeaturename_).tagged_ptr_.ptr_ &
                    0xfffffffffffffffe) + 8);
  if (lVar7 != 0) {
    uVar4 = (uint)lVar7 | 1;
    iVar3 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
      }
    }
    sVar9 = sVar9 + lVar7 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 1;
  }
  lVar7 = *(long *)(((ulong)(this->samplingtruncationinputfeaturename_).tagged_ptr_.ptr_ &
                    0xfffffffffffffffe) + 8);
  if (lVar7 != 0) {
    uVar4 = (uint)lVar7 | 1;
    iVar3 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
      }
    }
    sVar9 = sVar9 + lVar7 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 1;
  }
  lVar7 = *(long *)(((ulong)(this->meanoutputfeaturename_).tagged_ptr_.ptr_ & 0xfffffffffffffffe) +
                   8);
  if (lVar7 != 0) {
    uVar4 = (uint)lVar7 | 1;
    iVar3 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
      }
    }
    sVar9 = sVar9 + lVar7 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 2;
  }
  lVar7 = *(long *)(((ulong)(this->varianceoutputfeaturename_).tagged_ptr_.ptr_ & 0xfffffffffffffffe
                    ) + 8);
  if (lVar7 != 0) {
    uVar4 = (uint)lVar7 | 1;
    iVar3 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
      }
    }
    sVar9 = sVar9 + lVar7 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 2;
  }
  lVar7 = *(long *)(((ulong)(this->pessimisticprobabilityoutputfeaturename_).tagged_ptr_.ptr_ &
                    0xfffffffffffffffe) + 8);
  if (lVar7 != 0) {
    uVar4 = (uint)lVar7 | 1;
    iVar3 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
      }
    }
    sVar9 = sVar9 + lVar7 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 2;
  }
  lVar7 = *(long *)(((ulong)(this->sampledprobabilityoutputfeaturename_).tagged_ptr_.ptr_ &
                    0xfffffffffffffffe) + 8);
  if (lVar7 != 0) {
    uVar4 = (uint)lVar7 | 1;
    iVar3 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
      }
    }
    sVar9 = sVar9 + lVar7 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 2;
  }
  pBVar2 = this->bias_;
  if (pBVar2 != (BayesianProbitRegressor_Gaussian *)0x0 &&
      this != (BayesianProbitRegressor *)_BayesianProbitRegressor_default_instance_) {
    uVar6 = (ulong)(pBVar2->mean_ != 0.0);
    lVar7 = uVar6 * 9 + 9;
    if (pBVar2->precision_ == 0.0) {
      lVar7 = uVar6 * 9;
    }
    uVar6 = (pBVar2->super_MessageLite)._internal_metadata_.ptr_;
    if ((uVar6 & 1) != 0) {
      lVar7 = lVar7 + *(long *)((uVar6 & 0xfffffffffffffffc) + 0x10);
    }
    (pBVar2->_cached_size_).size_.super___atomic_base<int>._M_i = (uint)lVar7;
    uVar4 = (uint)lVar7 | 1;
    iVar3 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
      }
    }
    sVar9 = sVar9 + lVar7 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 1;
  }
  if (this->numberoffeatures_ != 0) {
    uVar4 = this->numberoffeatures_ | 1;
    iVar3 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
      }
    }
    sVar9 = sVar9 + (iVar3 * 9 + 0x89U >> 6);
  }
  uVar6 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar6 & 1) != 0) {
    sVar9 = sVar9 + *(long *)((uVar6 & 0xfffffffffffffffc) + 0x10);
  }
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type)sVar9;
  return sVar9;
}

Assistant:

size_t BayesianProbitRegressor::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.BayesianProbitRegressor)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated .CoreML.Specification.BayesianProbitRegressor.FeatureWeight features = 3;
  total_size += 1UL * this->_internal_features_size();
  for (const auto& msg : this->features_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // string regressionInputFeatureName = 10;
  if (!this->_internal_regressioninputfeaturename().empty()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_regressioninputfeaturename());
  }

  // string optimismInputFeatureName = 11;
  if (!this->_internal_optimisminputfeaturename().empty()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_optimisminputfeaturename());
  }

  // string samplingScaleInputFeatureName = 12;
  if (!this->_internal_samplingscaleinputfeaturename().empty()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_samplingscaleinputfeaturename());
  }

  // string samplingTruncationInputFeatureName = 13;
  if (!this->_internal_samplingtruncationinputfeaturename().empty()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_samplingtruncationinputfeaturename());
  }

  // string meanOutputFeatureName = 20;
  if (!this->_internal_meanoutputfeaturename().empty()) {
    total_size += 2 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_meanoutputfeaturename());
  }

  // string varianceOutputFeatureName = 21;
  if (!this->_internal_varianceoutputfeaturename().empty()) {
    total_size += 2 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_varianceoutputfeaturename());
  }

  // string pessimisticProbabilityOutputFeatureName = 22;
  if (!this->_internal_pessimisticprobabilityoutputfeaturename().empty()) {
    total_size += 2 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_pessimisticprobabilityoutputfeaturename());
  }

  // string sampledProbabilityOutputFeatureName = 23;
  if (!this->_internal_sampledprobabilityoutputfeaturename().empty()) {
    total_size += 2 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_sampledprobabilityoutputfeaturename());
  }

  // .CoreML.Specification.BayesianProbitRegressor.Gaussian bias = 2;
  if (this->_internal_has_bias()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
        *bias_);
  }

  // uint32 numberOfFeatures = 1;
  if (this->_internal_numberoffeatures() != 0) {
    total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::UInt32SizePlusOne(this->_internal_numberoffeatures());
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}